

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototypeNoLock
          (DynamicMessageFactory *this,Descriptor *type)

{
  FieldDescriptor *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  uint *puVar4;
  long lVar5;
  bool bVar6;
  CppStringType CVar7;
  DescriptorPool *pDVar8;
  DescriptorPool *pDVar9;
  long lVar10;
  uint *puVar11;
  uint *puVar12;
  OneofDescriptor *pOVar13;
  DynamicMessage *this_01;
  Reflection *this_02;
  uint uVar14;
  long lVar15;
  long *plVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  FieldDescriptor *pFVar20;
  ulong uVar21;
  uint uVar22;
  TypeInfo *pTVar23;
  Descriptor *pDVar24;
  int iVar25;
  string_view str;
  Descriptor *local_98;
  TypeInfo *local_90;
  long local_88;
  DynamicMessageFactory *local_80;
  undefined1 local_78 [56];
  __atomic_base<long> local_40;
  int local_38;
  
  local_98 = type;
  if (((this->delegate_to_generated_factory_ != true) ||
      (pDVar9 = type->file_->pool_, pDVar8 = DescriptorPool::generated_pool(), pDVar9 != pDVar8)) ||
     (this_01 = (DynamicMessage *)MessageFactory::TryGetGeneratedPrototype(type),
     this_01 == (DynamicMessage *)0x0)) {
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>>
    ::try_emplace_impl<google::protobuf::Descriptor_const*const&>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>::iterator,_bool>
                *)local_78,&this->prototypes_,&local_98);
    if (*(long *)(local_78._8_8_ + 8) == 0) {
      local_90 = (TypeInfo *)operator_new(0xa0);
      pDVar24 = local_98;
      local_90->offsets =
           (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)0x0;
      local_90->has_bits_indices =
           (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)0x0;
      (local_90->class_data).super_ClassData.prototype = (MessageLite *)0x0;
      (local_90->class_data).super_ClassData.tc_table = (TcParseTableBase *)0x0;
      (local_90->class_data).super_ClassData.on_demand_register_arena_dtor =
           (_func_void_MessageLite_ptr_Arena_ptr *)0x0;
      (local_90->class_data).super_ClassData.is_initialized = Message::IsInitializedImpl;
      (local_90->class_data).super_ClassData.merge_to_from = Message::MergeImpl;
      (local_90->class_data).super_ClassData.message_creator.allocation_size_ = 0;
      (local_90->class_data).super_ClassData.message_creator.tag_ = kZeroInit;
      (local_90->class_data).super_ClassData.message_creator.alignment_ = '\0';
      (local_90->class_data).super_ClassData.message_creator.field_3.func_ = (Func)0x0;
      (local_90->class_data).super_ClassData.cached_size_offset = 0x18;
      (local_90->class_data).super_ClassData.is_lite = false;
      (local_90->class_data).descriptor_methods = (DescriptorMethods *)Message::kDescriptorMethods;
      (local_90->class_data).descriptor_table = (DescriptorTable *)0x0;
      (local_90->class_data).reflection = (Reflection *)0x0;
      (local_90->class_data).descriptor = (Descriptor *)0x0;
      (local_90->class_data).get_metadata_tracker = (_func_void *)0x0;
      *(TypeInfo **)(local_78._8_8_ + 8) = local_90;
      (local_90->class_data).descriptor = local_98;
      (local_90->class_data).super_ClassData.is_dynamic = true;
      pDVar9 = this->pool_;
      if (pDVar9 == (DescriptorPool *)0x0) {
        pDVar9 = local_98->file_->pool_;
      }
      local_90->pool = pDVar9;
      local_90->factory = this;
      local_88 = (long)local_98->real_oneof_decl_count_;
      lVar10 = local_98->field_count_ + local_88;
      uVar21 = 0xffffffffffffffff;
      if (-1 < (int)lVar10) {
        uVar21 = lVar10 * 4;
      }
      local_80 = this;
      puVar11 = (uint *)operator_new__(uVar21);
      puVar12 = (local_90->offsets)._M_t.
                super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
      (local_90->offsets)._M_t.
      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = puVar11;
      if (puVar12 != (uint *)0x0) {
        operator_delete__(puVar12);
        pDVar24 = local_98;
      }
      local_90->has_bits_offset = -1;
      uVar22 = 0x20;
      uVar17 = 0;
      if (pDVar24->field_count_ < 1) {
        bVar6 = false;
        iVar19 = (int)local_88;
      }
      else {
        lVar10 = 0;
        do {
          pFVar20 = pDVar24->fields_ + lVar10;
          bVar6 = internal::cpp::HasHasbit(pFVar20);
          if ((bVar6) &&
             (((bVar6 = FieldDescriptor::has_presence(pFVar20), pDVar24 = local_98, bVar6 ||
               (pFVar20->containing_type_ == (Descriptor *)0x0)) ||
              ((pFVar20->containing_type_->options_->field_0)._impl_.map_entry_ == false)))) {
            pTVar23 = local_90;
            if (local_90->has_bits_offset == -1) {
              local_90->has_bits_offset = 0x20;
              uVar21 = (long)local_98->field_count_ * 4;
              if ((long)local_98->field_count_ < 0) {
                uVar21 = 0xffffffffffffffff;
              }
              puVar12 = (uint *)operator_new__(uVar21);
              pTVar23 = local_90;
              if (0 < pDVar24->field_count_) {
                lVar15 = 0;
                do {
                  puVar12[lVar15] = 0xffffffff;
                  lVar15 = lVar15 + 1;
                } while (lVar15 < pDVar24->field_count_);
              }
              puVar4 = (local_90->has_bits_indices)._M_t.
                       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
              (local_90->has_bits_indices)._M_t.
              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = puVar12;
              if (puVar4 != (uint *)0x0) {
                operator_delete__(puVar4);
              }
            }
            (pTVar23->has_bits_indices)._M_t.
            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar10] = uVar17;
            uVar17 = uVar17 + 1;
          }
          lVar10 = lVar10 + 1;
          pDVar24 = local_98;
        } while (lVar10 < local_98->field_count_);
        bVar6 = 0 < local_98->field_count_;
        iVar19 = (int)local_88;
        if (0 < (int)uVar17) {
          iVar18 = uVar17 + 0x3e;
          if (-1 < (int)(uVar17 + 0x1f)) {
            iVar18 = uVar17 + 0x1f;
          }
          uVar17 = (iVar18 >> 5) * 4 + 0x27;
          uVar22 = (iVar18 >> 5) * 4 + 0x2e;
          if (-1 < (int)uVar17) {
            uVar22 = uVar17;
          }
          uVar22 = uVar22 & 0xfffffff8;
        }
      }
      if (0 < iVar19) {
        local_90->oneof_case_offset = uVar22;
        uVar17 = uVar22 + iVar19 * 4 + 7;
        uVar22 = uVar22 + iVar19 * 4 + 0xe;
        if (-1 < (int)uVar17) {
          uVar22 = uVar17;
        }
        uVar22 = uVar22 & 0xfffffff8;
      }
      if (pDVar24->extension_range_count_ < 1) {
        uVar14 = 0xffffffff;
        uVar17 = uVar22;
      }
      else {
        uVar17 = uVar22 + 0x26;
        if (-1 < (int)(uVar22 + 0x1f)) {
          uVar17 = uVar22 + 0x1f;
        }
        uVar17 = uVar17 & 0xfffffff8;
        uVar14 = uVar22;
      }
      local_90->extensions_offset = uVar14;
      if (bVar6) {
        lVar15 = 0;
        lVar10 = 0;
        do {
          pFVar20 = pDVar24->fields_;
          bVar3 = (&pFVar20->field_0x1)[lVar15];
          if (((&pFVar20->field_0x3)[lVar15] & 1) != 0) {
            if ((bVar3 & 0x10) != 0) {
              lVar5 = *(long *)((long)&pFVar20->scope_ + lVar15);
              if (lVar5 == 0) {
                internal::protobuf_assumption_failed
                          ("res != nullptr",
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                           ,0xb31);
              }
              if ((*(int *)(lVar5 + 4) != 1) || ((*(byte *)(*(long *)(lVar5 + 0x30) + 1) & 2) == 0))
              goto LAB_001ccc3e;
              goto LAB_001ccf16;
            }
            goto LAB_001ccf20;
          }
          if (0xbf < bVar3 != (bool)((bVar3 & 0x20) >> 5)) {
LAB_001ccf00:
            GetPrototypeNoLock();
LAB_001ccf16:
            GetPrototypeNoLock((DynamicMessageFactory *)local_78);
LAB_001ccf20:
            internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb63);
          }
          this_00 = (FieldDescriptor *)(&pFVar20->super_SymbolBase + lVar15);
          iVar19 = *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                           (ulong)(&pFVar20->type_)[lVar15] * 4);
          if ((bVar3 & 0x20) != 0) {
            iVar25 = 8;
            iVar18 = 0x10;
            if (7 < iVar19 - 1U) {
              if (iVar19 == 9) {
                CVar7 = FieldDescriptor::cpp_string_type(this_00);
                if (2 < CVar7 - kView) goto switchD_001ccc09_default;
                iVar18 = *(int *)(&DAT_00358c7c + (ulong)(CVar7 - kView) * 4);
              }
              else {
                if (iVar19 != 10) goto switchD_001ccc09_default;
                iVar18 = 0x18;
                if ((&pFVar20->type_)[lVar15] == 0xb) {
                  bVar6 = FieldDescriptor::is_map_message_type(this_00);
                  iVar18 = 0x18;
                  if (bVar6) {
                    iVar18 = 0x30;
                  }
                }
              }
            }
            goto LAB_001ccc23;
          }
          switch(iVar19) {
          case 1:
          case 3:
          case 6:
          case 8:
            iVar18 = 4;
            iVar25 = 4;
            break;
          case 2:
          case 4:
          case 5:
          case 10:
            iVar18 = 8;
            goto LAB_001ccc1d;
          case 7:
            iVar18 = 1;
            iVar25 = 1;
            break;
          case 9:
            CVar7 = FieldDescriptor::cpp_string_type(this_00);
            if (2 < CVar7 - kView) goto switchD_001ccc09_default;
            iVar18 = *(int *)(&DAT_00358c88 + (ulong)(CVar7 - kView) * 4);
LAB_001ccc1d:
            iVar25 = 8;
            break;
          default:
switchD_001ccc09_default:
            absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                      ((LogMessageDebugFatal *)local_78,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/dynamic_message.cc"
                       ,0x102);
            str._M_str = "Can\'t get here.";
            str._M_len = 0xf;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      ((LogMessage *)local_78,str);
            absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                      ((LogMessageDebugFatal *)local_78);
            iVar18 = 0;
            iVar25 = 0;
          }
LAB_001ccc23:
          iVar19 = uVar17 + iVar25 + -1;
          uVar17 = iVar19 - iVar19 % iVar25;
          puVar11[lVar10] = uVar17;
          uVar17 = uVar17 + iVar18;
          pDVar24 = local_98;
LAB_001ccc3e:
          lVar10 = lVar10 + 1;
          lVar15 = lVar15 + 0x58;
        } while (lVar10 < pDVar24->field_count_);
      }
      if (0 < pDVar24->real_oneof_decl_count_) {
        lVar10 = 0;
        do {
          uVar22 = uVar17 + 0xe;
          if (-1 < (int)(uVar17 + 7)) {
            uVar22 = uVar17 + 7;
          }
          puVar11[pDVar24->field_count_ + lVar10] = uVar22 & 0xfffffff8;
          uVar17 = (uVar22 & 0xfffffff8) + 8;
          lVar10 = lVar10 + 1;
        } while ((int)lVar10 < pDVar24->real_oneof_decl_count_);
      }
      local_90->weak_field_map_offset = -1;
      (local_90->class_data).super_ClassData.message_creator.allocation_size_ = uVar17;
      (local_90->class_data).super_ClassData.message_creator.tag_ = kFunc;
      (local_90->class_data).super_ClassData.message_creator.alignment_ = '\b';
      (local_90->class_data).super_ClassData.message_creator.field_3.func_ = DynamicMessage::NewImpl
      ;
      if (0 < pDVar24->real_oneof_decl_count_) {
        iVar19 = 0;
        do {
          pOVar13 = Descriptor::real_oneof_decl(pDVar24,iVar19);
          if (0 < pOVar13->field_count_) {
            lVar10 = 0;
            lVar15 = 0;
            do {
              pOVar13 = Descriptor::real_oneof_decl(local_98,iVar19);
              if (pOVar13->field_count_ <= lVar15) {
                GetPrototypeNoLock();
                goto LAB_001ccf00;
              }
              pFVar20 = pOVar13->fields_;
              if (((&pFVar20->field_0x1)[lVar10] & 8) == 0) {
                plVar16 = (long *)(*(long *)((long)&pFVar20->containing_type_ + lVar10) + 0x40);
              }
              else {
                lVar5 = *(long *)((long)&pFVar20->scope_ + lVar10);
                if (lVar5 == 0) {
                  plVar16 = (long *)(*(long *)((long)&pFVar20->file_ + lVar10) + 0x78);
                }
                else {
                  plVar16 = (long *)(lVar5 + 0x68);
                }
              }
              puVar11[(int)((ulong)((long)pFVar20 + (lVar10 - *plVar16)) >> 3) * -0x45d1745d] =
                   0x40000000;
              lVar15 = lVar15 + 1;
              pOVar13 = Descriptor::real_oneof_decl(local_98,iVar19);
              lVar10 = lVar10 + 0x58;
            } while (lVar15 < pOVar13->field_count_);
          }
          iVar19 = iVar19 + 1;
          pDVar24 = local_98;
        } while (iVar19 < local_98->real_oneof_decl_count_);
      }
      this_01 = (DynamicMessage *)operator_new((long)(int)uVar17);
      memset(this_01,0,(long)(int)uVar17);
      pTVar23 = local_90;
      DynamicMessage::DynamicMessage(this_01,local_90,false);
      local_78._0_8_ = (pTVar23->class_data).super_ClassData.prototype;
      local_78._8_8_ =
           (pTVar23->offsets)._M_t.
           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
      local_78._16_8_ =
           (pTVar23->has_bits_indices)._M_t.
           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
      local_78._24_4_ = pTVar23->has_bits_offset;
      uVar1 = pTVar23->oneof_case_offset;
      uVar2 = pTVar23->extensions_offset;
      local_78._32_4_ = uVar1;
      local_78._28_4_ = uVar2;
      local_78._36_4_ = (pTVar23->class_data).super_ClassData.message_creator.allocation_size_;
      local_78._40_4_ = pTVar23->weak_field_map_offset;
      local_78._48_8_ = (MaybeInitializedPtr)0x0;
      local_40._M_i = -0x100000000;
      local_38 = -1;
      this_02 = (Reflection *)operator_new(0x70);
      Reflection::Reflection
                (this_02,(pTVar23->class_data).descriptor,(ReflectionSchema *)local_78,pTVar23->pool
                 ,&local_80->super_MessageFactory);
      (pTVar23->class_data).reflection = this_02;
      DynamicMessage::CrossLinkPrototypes(this_01);
    }
    else {
      this_01 = *(DynamicMessage **)(*(long *)(local_78._8_8_ + 8) + 0x38);
    }
  }
  return &this_01->super_Message;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototypeNoLock(
    const Descriptor* PROTOBUF_NONNULL type) {
  if (delegate_to_generated_factory_ &&
      type->file()->pool() == DescriptorPool::generated_pool()) {
    const Message* result = MessageFactory::TryGetGeneratedPrototype(type);
    if (result != nullptr) return result;
    // Otherwise, we will create it dynamically so keep going.
  }

  const TypeInfo** target = &prototypes_[type];
  if (*target != nullptr) {
    // Already exists.
    return static_cast<const Message*>((*target)->class_data.prototype);
  }

  TypeInfo* type_info = new TypeInfo;
  *target = type_info;

  type_info->class_data.descriptor = type;
  type_info->class_data.is_dynamic = true;
  type_info->pool = (pool_ == nullptr) ? type->file()->pool() : pool_;
  type_info->factory = this;

  // We need to construct all the structures passed to Reflection's constructor.
  // This includes:
  // - A block of memory that contains space for all the message's fields.
  // - An array of integers indicating the byte offset of each field within
  //   this block.
  // - A big bitfield containing a bit for each field indicating whether
  //   or not that field is set.
  int real_oneof_count = type->real_oneof_decl_count();

  // Compute size and offsets.
  uint32_t* offsets = new uint32_t[type->field_count() + real_oneof_count];
  type_info->offsets.reset(offsets);

  // Decide all field offsets by packing in order.
  // We place the DynamicMessage object itself at the beginning of the allocated
  // space.
  int size = sizeof(DynamicMessage);
  size = AlignOffset(size);

  // Next the has_bits, which is an array of uint32s.
  type_info->has_bits_offset = -1;
  int max_hasbit = 0;
  for (int i = 0; i < type->field_count(); i++) {
    const FieldDescriptor* field = type->field(i);

    // If a field has hasbits, it could be either an explicit-presence or
    // implicit-presence field. Explicit presence fields will have "true
    // hasbits" where hasbit is set iff field is present. Implicit presence
    // fields will have "hint hasbits" where
    // - if hasbit is unset, field is not present.
    // - if hasbit is set, field is present if it is also nonempty.
    if (internal::cpp::HasHasbit(field)) {
      // TODO: b/112602698 - during Python textproto serialization, MapEntry
      // messages may be generated from DynamicMessage on the fly. C++
      // implementations of MapEntry messages always have hasbits, but
      // has_presence return values might be different depending on how field
      // presence is set. For MapEntrys, has_presence returns true for
      // explicit-presence (proto2) messages and returns false for
      // implicit-presence (proto3) messages.
      //
      // In the case of implicit presence, there is a potential inconsistency in
      // code behavior between C++ and Python:
      // - If C++ implementation is linked, hasbits are always generated for
      //   MapEntry messages, and MapEntry messages will behave like explicit
      //   presence.
      // - If C++ implementation is not linked, Python defaults to the
      //   DynamicMessage implementation for MapEntrys which traditionally does
      //   not assume the presence of hasbits, so the default Python behavior
      //   for MapEntry messages (by default C++ implementations are not linked)
      //   will fall back to the DynamicMessage implementation and behave like
      //   implicit presence.
      // This is an inconsistency and this if-condition preserves it.
      //
      // Longer term, we want to get rid of this additional if-check of
      // IsMapEntryField. It might take one or more breaking changes and more
      // consensus gathering & clarification though.
      if (!field->has_presence() && IsMapEntryField(field)) {
        continue;
      }

      if (type_info->has_bits_offset == -1) {
        // At least one field in the message requires a hasbit, so allocate
        // hasbits.
        type_info->has_bits_offset = size;
        uint32_t* has_bits_indices = new uint32_t[type->field_count()];
        for (int j = 0; j < type->field_count(); j++) {
          // Initialize to -1, fields that need a hasbit will overwrite.
          has_bits_indices[j] = static_cast<uint32_t>(-1);
        }
        type_info->has_bits_indices.reset(has_bits_indices);
      }
      type_info->has_bits_indices[i] = max_hasbit++;
    }
  }

  if (max_hasbit > 0) {
    int has_bits_array_size = DivideRoundingUp(max_hasbit, bitsizeof(uint32_t));
    size += has_bits_array_size * sizeof(uint32_t);
    size = AlignOffset(size);
  }

  // The oneof_case, if any. It is an array of uint32s.
  if (real_oneof_count > 0) {
    type_info->oneof_case_offset = size;
    size += real_oneof_count * sizeof(uint32_t);
    size = AlignOffset(size);
  }

  // The ExtensionSet, if any.
  if (type->extension_range_count() > 0) {
    type_info->extensions_offset = size;
    size += sizeof(ExtensionSet);
    size = AlignOffset(size);
  } else {
    // No extensions.
    type_info->extensions_offset = -1;
  }

  // All the fields.
  //
  // TODO:  Optimize the order of fields to minimize padding.
  for (int i = 0; i < type->field_count(); i++) {
    // Make sure field is aligned to avoid bus errors.
    // Oneof fields do not use any space.
    if (!InRealOneof(type->field(i))) {
      int field_size = FieldSpaceUsed(type->field(i));
      size = AlignTo(size, std::min(kSafeAlignment, field_size));
      offsets[i] = size;
      size += field_size;
    }
  }

  // The oneofs.
  for (int i = 0; i < type->real_oneof_decl_count(); i++) {
    size = AlignTo(size, kSafeAlignment);
    offsets[type->field_count() + i] = size;
    size += kMaxOneofUnionSize;
  }

  type_info->weak_field_map_offset = -1;

  type_info->class_data.message_creator =
      internal::MessageCreator(DynamicMessage::NewImpl, size, kSafeAlignment);

  // Construct the reflection object.

  // Compute the size of default oneof instance and offsets of default
  // oneof fields.
  for (int i = 0; i < type->real_oneof_decl_count(); i++) {
    for (int j = 0; j < type->real_oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = type->real_oneof_decl(i)->field(j);
      // oneof fields are not accessed through offsets, but we still have the
      // entry for each.
      // Mark the field to prevent unintentional access through reflection.
      // Don't use the top bit because that is for unused fields.
      offsets[field->index()] = internal::kInvalidFieldOffsetTag;
    }
  }

  // Allocate the prototype fields.
  void* base = operator new(size);
  memset(base, 0, size);

  // We have already locked the factory so we should not lock in the constructor
  // of dynamic message to avoid dead lock.
  DynamicMessage* prototype = new (base) DynamicMessage(type_info, false);

  internal::ReflectionSchema schema = {
      static_cast<const Message*>(type_info->class_data.prototype),
      type_info->offsets.get(),
      type_info->has_bits_indices.get(),
      type_info->has_bits_offset,
      type_info->extensions_offset,
      type_info->oneof_case_offset,
      static_cast<int>(type_info->class_data.allocation_size()),
      type_info->weak_field_map_offset,
      nullptr,  // inlined_string_indices_
      0,        // inlined_string_donated_offset_
      -1,       // split_offset_
      -1,       // sizeof_split_
  };

  type_info->class_data.reflection = new Reflection(
      type_info->class_data.descriptor, schema, type_info->pool, this);

  // Cross link prototypes.
  prototype->CrossLinkPrototypes();

  return prototype;
}